

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

void vkt::api::anon_unknown_1::GraphicsPipeline::initPrograms(SourceCollections *dst)

{
  SourceCollections *dst_00;
  allocator<char> local_c1;
  string local_c0;
  Parameters local_a0;
  allocator<char> local_61;
  string local_60;
  Parameters local_40;
  SourceCollections *local_18;
  SourceCollections *dst_local;
  
  local_18 = dst;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"vert",&local_61);
  ShaderModule::Parameters::Parameters(&local_40,VK_SHADER_STAGE_VERTEX_BIT,&local_60);
  ShaderModule::initPrograms(dst,&local_40);
  ShaderModule::Parameters::~Parameters(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  dst_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"frag",&local_c1);
  ShaderModule::Parameters::Parameters(&local_a0,VK_SHADER_STAGE_FRAGMENT_BIT,&local_c0);
  ShaderModule::initPrograms(dst_00,&local_a0);
  ShaderModule::Parameters::~Parameters(&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  return;
}

Assistant:

static void initPrograms (SourceCollections& dst, Parameters)
	{
		ShaderModule::initPrograms(dst, ShaderModule::Parameters(VK_SHADER_STAGE_VERTEX_BIT, "vert"));
		ShaderModule::initPrograms(dst, ShaderModule::Parameters(VK_SHADER_STAGE_FRAGMENT_BIT, "frag"));
	}